

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::Extend(ON_PolylineCurve *this,ON_Interval *domain)

{
  double dVar1;
  ON_Interval *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int i;
  double *pdVar5;
  ON_3dPoint *pOVar6;
  ON_3dPoint *pOVar7;
  double dVar8;
  double dVar9;
  ON_3dVector local_e0;
  undefined1 local_c8 [8];
  ON_3dPoint Q1;
  ON_3dVector V_1;
  double len_1;
  undefined1 local_88 [4];
  int last;
  undefined1 local_70 [8];
  ON_3dPoint Q0;
  ON_3dVector V;
  double len;
  byte local_21;
  ON_Interval *pOStack_20;
  bool changed;
  ON_Interval *domain_local;
  ON_PolylineCurve *this_local;
  
  pOStack_20 = domain;
  domain_local = (ON_Interval *)this;
  uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((uVar3 & 1) == 0) {
    iVar4 = PointCount(this);
    if (iVar4 < 2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = ON_Interval::IsIncreasing(pOStack_20);
      this_00 = pOStack_20;
      if (bVar2) {
        local_21 = 0;
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
        bVar2 = ON_Interval::operator==(this_00,(ON_Interval *)&len);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          dVar8 = ON_Interval::operator[](pOStack_20,0);
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
          if (dVar8 < *pdVar5) {
            local_21 = 1;
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,1);
            dVar8 = *pdVar5;
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
            dVar1 = *pdVar5;
            if (dVar8 - dVar1 <= 0.0) {
              return false;
            }
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,1);
            pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
            ON_3dPoint::operator-((ON_3dVector *)&Q0.z,pOVar6,pOVar7);
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
            local_70 = (undefined1  [8])pOVar6->x;
            Q0.x = pOVar6->y;
            Q0.y = pOVar6->z;
            dVar9 = ON_Interval::operator[](pOStack_20,0);
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
            ::operator*((ON_3dVector *)local_88,(dVar9 - *pdVar5) / (dVar8 - dVar1),
                        (ON_3dVector *)&Q0.z);
            ON_3dPoint::operator+=((ON_3dPoint *)local_70,(ON_3dVector *)local_88);
            dVar8 = ON_Interval::operator[](pOStack_20,0);
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
            *pdVar5 = dVar8;
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
            pOVar6->x = (double)local_70;
            pOVar6->y = Q0.x;
            pOVar6->z = Q0.y;
          }
          iVar4 = PointCount(this);
          i = iVar4 + -1;
          dVar8 = ON_Interval::operator[](pOStack_20,1);
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,i);
          if (*pdVar5 <= dVar8 && dVar8 != *pdVar5) {
            local_21 = 1;
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,i);
            dVar8 = *pdVar5;
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,iVar4 + -2);
            dVar1 = *pdVar5;
            if (dVar8 - dVar1 <= 0.0) {
              return false;
            }
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,i);
            pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar4 + -2);
            ON_3dPoint::operator-((ON_3dVector *)&Q1.z,pOVar6,pOVar7);
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,i);
            local_c8 = (undefined1  [8])pOVar6->x;
            Q1.x = pOVar6->y;
            Q1.y = pOVar6->z;
            dVar9 = ON_Interval::operator[](pOStack_20,1);
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,i);
            ::operator*(&local_e0,(dVar9 - *pdVar5) / (dVar8 - dVar1),(ON_3dVector *)&Q1.z);
            ON_3dPoint::operator+=((ON_3dPoint *)local_c8,&local_e0);
            dVar8 = ON_Interval::operator[](pOStack_20,1);
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,i);
            *pdVar5 = dVar8;
            pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,i);
            pOVar6->x = (double)local_c8;
            pOVar6->y = Q1.x;
            pOVar6->z = Q1.y;
          }
          if ((local_21 & 1) != 0) {
            ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
          }
          this_local._7_1_ = (bool)(local_21 & 1);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolylineCurve::Extend(
  const ON_Interval& domain
  )

{
  if (IsClosed()) 
    return false;
  if (PointCount() < 2) 
    return false;
  if ( !domain.IsIncreasing() )
    return false;
  bool changed = false;
  if ( domain == Domain() )
    return true;
  
  if (domain[0] < m_t[0]){
    changed = true;
    double len = m_t[1] - m_t[0];
    if ( len <= 0.0 )
      return false;
    ON_3dVector V = m_pline[1] - m_pline[0];
    ON_3dPoint Q0 = m_pline[0];
    Q0 += (domain[0]-m_t[0])/len*V;
    m_t[0] = domain[0];
    m_pline[0] = Q0;
  }

  int last = PointCount()-1;
  if (domain[1] > m_t[last]){
    changed = true;
    double len = m_t[last] - m_t[last-1];
    if ( len <= 0.0 )
      return false;
    ON_3dVector V = m_pline[last] - m_pline[last-1];
    ON_3dPoint Q1 = m_pline[last];
    Q1 += (domain[1]-m_t[last])/len*V;
    m_t[last] = domain[1];
    m_pline[last] = Q1;
  }

  if (changed){
    DestroyCurveTree();
  }
  return changed;
}